

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O1

void aom_smooth_v_predictor_4x16_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  undefined4 uVar1;
  int iVar2;
  uint8_t *puVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  __m128i y_select;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar14 [16];
  undefined1 auVar9 [16];
  undefined1 auVar15 [16];
  undefined1 auVar10 [16];
  undefined1 auVar16 [16];
  
  auVar12 = _DAT_00516130;
  auVar6 = _DAT_00516120;
  uVar1 = *(undefined4 *)top_row;
  auVar5 = pshuflw(ZEXT116(left_column[0xf]),ZEXT116(left_column[0xf]),0);
  auVar4[0] = (byte)uVar1;
  auVar4[1] = 0;
  auVar7._0_12_ = ZEXT712(0);
  auVar7[0xc] = (char)((uint)uVar1 >> 0x18);
  auVar7[0xd] = 0;
  auVar7._14_2_ = auVar5._6_2_;
  auVar19._12_4_ = auVar7._12_4_;
  auVar19._0_10_ = (unkuint10)0;
  auVar19._10_2_ = auVar5._4_2_;
  auVar4[9] = 0;
  auVar4[8] = (byte)((uint)uVar1 >> 0x10);
  auVar4._10_6_ = auVar19._10_6_;
  auVar4._6_2_ = auVar5._2_2_;
  auVar4[5] = 0;
  auVar4[4] = (byte)((uint)uVar1 >> 8);
  auVar4._2_2_ = auVar5._0_2_;
  iVar2 = 8;
  puVar3 = dst;
  auVar19 = _DAT_00516090;
  do {
    auVar7 = pshufb(auVar6,auVar19);
    auVar18 = pshufb(auVar12,auVar19);
    auVar10._0_12_ = auVar7._0_12_;
    auVar10._12_2_ = auVar7._6_2_;
    auVar10._14_2_ = auVar18._6_2_;
    auVar9._12_4_ = auVar10._12_4_;
    auVar9._0_10_ = auVar7._0_10_;
    auVar9._10_2_ = auVar18._4_2_;
    auVar8._10_6_ = auVar9._10_6_;
    auVar8._0_8_ = auVar7._0_8_;
    auVar8._8_2_ = auVar7._4_2_;
    auVar5._8_8_ = auVar8._8_8_;
    auVar5._6_2_ = auVar18._2_2_;
    auVar5._4_2_ = auVar7._2_2_;
    auVar5._0_2_ = auVar7._0_2_;
    auVar5._2_2_ = auVar18._0_2_;
    auVar7 = pmaddwd(auVar5,auVar4);
    auVar11._0_4_ = auVar7._0_4_ + 0x80;
    auVar11._4_4_ = auVar7._4_4_ + 0x80;
    auVar11._8_4_ = auVar7._8_4_ + 0x80;
    auVar11._12_4_ = auVar7._12_4_ + 0x80;
    auVar7 = pshufb(auVar11,ZEXT416(0xd090501));
    *(int *)puVar3 = auVar7._0_4_;
    auVar5 = _DAT_00516160;
    auVar7 = _DAT_00516150;
    puVar3 = puVar3 + stride;
    auVar18._0_2_ = auVar19._0_2_ + 0x202;
    auVar18._2_2_ = auVar19._2_2_ + 0x202;
    auVar18._4_2_ = auVar19._4_2_ + 0x202;
    auVar18._6_2_ = auVar19._6_2_ + 0x202;
    auVar18._8_2_ = auVar19._8_2_ + 0x202;
    auVar18._10_2_ = auVar19._10_2_ + 0x202;
    auVar18._12_2_ = auVar19._12_2_ + 0x202;
    auVar18._14_2_ = auVar19._14_2_ + 0x202;
    iVar2 = iVar2 + -1;
    auVar19 = auVar18;
  } while (iVar2 != 0);
  puVar3 = dst + stride * 8;
  iVar2 = 8;
  auVar6 = _DAT_00516090;
  do {
    auVar12 = pshufb(auVar7,auVar6);
    auVar19 = pshufb(auVar5,auVar6);
    auVar16._0_12_ = auVar12._0_12_;
    auVar16._12_2_ = auVar12._6_2_;
    auVar16._14_2_ = auVar19._6_2_;
    auVar15._12_4_ = auVar16._12_4_;
    auVar15._0_10_ = auVar12._0_10_;
    auVar15._10_2_ = auVar19._4_2_;
    auVar14._10_6_ = auVar15._10_6_;
    auVar14._0_8_ = auVar12._0_8_;
    auVar14._8_2_ = auVar12._4_2_;
    auVar13._8_8_ = auVar14._8_8_;
    auVar13._6_2_ = auVar19._2_2_;
    auVar13._4_2_ = auVar12._2_2_;
    auVar13._0_2_ = auVar12._0_2_;
    auVar13._2_2_ = auVar19._0_2_;
    auVar12 = pmaddwd(auVar13,auVar4);
    auVar17._0_4_ = auVar12._0_4_ + 0x80;
    auVar17._4_4_ = auVar12._4_4_ + 0x80;
    auVar17._8_4_ = auVar12._8_4_ + 0x80;
    auVar17._12_4_ = auVar12._12_4_ + 0x80;
    auVar12 = pshufb(auVar17,ZEXT416(0xd090501));
    *(int *)puVar3 = auVar12._0_4_;
    puVar3 = puVar3 + stride;
    auVar12._0_2_ = auVar6._0_2_ + 0x202;
    auVar12._2_2_ = auVar6._2_2_ + 0x202;
    auVar12._4_2_ = auVar6._4_2_ + 0x202;
    auVar12._6_2_ = auVar6._6_2_ + 0x202;
    auVar12._8_2_ = auVar6._8_2_ + 0x202;
    auVar12._10_2_ = auVar6._10_2_ + 0x202;
    auVar12._12_2_ = auVar6._12_2_ + 0x202;
    auVar12._14_2_ = auVar6._14_2_ + 0x202;
    iVar2 = iVar2 + -1;
    auVar6 = auVar12;
  } while (iVar2 != 0);
  return;
}

Assistant:

void aom_smooth_v_predictor_4x16_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  __m128i pixels;
  load_smooth_vertical_pixels4(top_row, left_column, 16, &pixels);

  __m128i weights[4];
  load_smooth_vertical_weights4(smooth_weights, 16, weights);

  write_smooth_vertical4xh(&pixels, weights, 8, dst, stride);
  dst += stride << 3;
  write_smooth_vertical4xh(&pixels, &weights[2], 8, dst, stride);
}